

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O1

bool __thiscall Datetime::parse_off_ext(Datetime *this,Pig *pig)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint c;
  undefined8 in_RAX;
  size_type previous;
  int iVar5;
  Datetime *pDVar6;
  int minute;
  int hour;
  undefined8 local_28;
  
  local_28 = in_RAX;
  previous = Pig::cursor(pig);
  iVar3 = Pig::peek(pig);
  if ((iVar3 != 0x2d) && (iVar3 != 0x2b)) goto LAB_00130267;
  pDVar6 = (Datetime *)pig;
  Pig::skipN(pig,1);
  local_28 = 0;
  bVar2 = parse_off_hour(pDVar6,pig,(int *)((long)&local_28 + 4));
  if (bVar2) {
    pDVar6 = (Datetime *)pig;
    bVar2 = Pig::skip(pig,0x3a);
    if ((!bVar2) || (bVar2 = parse_off_minute(pDVar6,pig,(int *)&local_28), bVar2)) {
      iVar5 = (int)local_28 * 0x3c + local_28._4_4_ * 0xe10;
      iVar4 = -iVar5;
      if (iVar3 != 0x2d) {
        iVar4 = iVar5;
      }
      this->_offset = iVar4;
      c = Pig::peek(pig);
      bVar2 = unicodeLatinDigit(c);
      if (bVar2) goto LAB_0013024c;
      bVar2 = true;
    }
    else {
      Pig::restoreTo(pig,previous);
      bVar2 = false;
    }
    bVar1 = false;
  }
  else {
LAB_0013024c:
    bVar1 = true;
  }
  if (!bVar1) {
    return bVar2;
  }
LAB_00130267:
  Pig::restoreTo(pig,previous);
  return false;
}

Assistant:

bool Datetime::parse_off_ext (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  int sign = pig.peek ();
  if (sign == '+' || sign == '-')
  {
    pig.skipN (1);

    int hour {0};
    int minute {0};

    if (parse_off_hour (pig, hour))
    {
      if (pig.skip (':'))
      {
        if (! parse_off_minute (pig, minute))
        {
          pig.restoreTo (checkpoint);
          return false;
        }
      }

      _offset = (hour * 3600) + (minute * 60);
      if (sign == '-')
        _offset = - _offset;

      if (! unicodeLatinDigit (pig.peek ()))
        return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}